

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintAttribute(TidyDocImpl *doc,uint indent,Node *node,AttVal *attr)

{
  int iVar1;
  AttVal *pAVar2;
  Attribute *pAVar3;
  byte bVar4;
  Bool BVar5;
  uint uVar6;
  uint uVar7;
  Bool scriptAttr;
  Node *pNVar8;
  ulong uVar9;
  ctmbstr value;
  tmbstr *pptVar10;
  int iVar11;
  uint indent_00;
  undefined4 in_register_00000034;
  ulong uVar12;
  byte *attrname;
  tchar c;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  int local_54;
  AttVal *local_50;
  Node *local_48;
  ulong local_40;
  ulong local_38;
  
  local_60 = CONCAT44(in_register_00000034,indent);
  local_40 = (ulong)*(uint *)((doc->config).value + 100);
  local_38 = (ulong)*(uint *)((doc->config).value + 0x62);
  local_54 = *(int *)((doc->config).value + 0x5b);
  iVar1 = *(int *)((doc->config).value + 0x54);
  uVar12 = (ulong)*(uint *)((doc->config).value + 0x23);
  iVar11 = *(int *)((doc->config).value + 0x26);
  local_48 = node;
  if (node->element != (tmbstr)0x0) {
    pptVar10 = &node->element;
    local_68 = uVar12;
    BVar5 = prvTidynodeHasCM(node,0x10);
    if (BVar5 != no) {
      pNVar8 = node->parent;
      if (node->parent == (Node *)0x0) {
        pNVar8 = node;
      }
      BVar5 = ShouldIndent(doc,pNVar8);
      node = local_48;
      if (BVar5 != no) {
        pNVar8 = prvTidyFindContainer(local_48);
        uVar12 = local_68;
        if (pNVar8 == (Node *)0x0) goto LAB_001499dc;
        pptVar10 = &pNVar8->element;
      }
    }
    uVar6 = prvTidytmbstrlen(*pptVar10);
    iVar11 = uVar6 + 2;
    node = local_48;
    uVar12 = local_68;
  }
LAB_001499dc:
  pAVar2 = node->attributes;
  attrname = (byte *)attr->attribute;
  local_68 = local_68 & 0xffffffff00000000;
  local_50 = attr;
  if (uVar12 == 0) {
    iVar11 = 0;
  }
  else {
    BVar5 = prvTidynodeIsElement(node);
    if (BVar5 != no && pAVar2 != attr) {
      indent_00 = (int)local_60 + iVar11;
      local_60 = (ulong)indent_00;
      PCondFlushLineSmart(doc,indent_00);
    }
  }
  CheckWrapIndent(doc,(uint)local_60);
  if ((local_38 == 0 && local_40 == 0) && (local_50->dict != (Attribute *)0x0)) {
    BVar5 = prvTidyIsScript(doc,(ctmbstr)attrname);
    uVar6 = (uint)local_60;
    if (BVar5 == no) {
      pAVar3 = local_50->dict;
      if (pAVar3 == (Attribute *)0x0) {
LAB_00149c84:
        if (local_54 != 0) {
LAB_00149c8f:
          local_68 = CONCAT44(local_68._4_4_,1);
        }
      }
      else if (pAVar3->id != TidyAttr_CONTENT) {
        if (pAVar3 == (Attribute *)0x0) goto LAB_00149c84;
        if (pAVar3->id == TidyAttr_VALUE) goto LAB_00149a80;
        if (pAVar3 == (Attribute *)0x0) goto LAB_00149c84;
        if (pAVar3->id == TidyAttr_ALT) goto LAB_00149a80;
        if (pAVar3 == (Attribute *)0x0) goto LAB_00149c84;
        if (pAVar3->id == TidyAttr_TITLE || local_54 == 0) goto LAB_00149a80;
        goto LAB_00149c8f;
      }
    }
    else {
      local_68 = CONCAT44(local_68._4_4_,*(undefined4 *)((doc->config).value + 0x5f));
    }
  }
  else {
    uVar6 = (uint)local_60;
  }
LAB_00149a80:
  if (pAVar2 != local_50) {
    uVar7 = (doc->pprint).linelen;
    uVar9 = (ulong)(uVar7 + uVar6);
    uVar12 = (doc->config).value[0x5d].v;
    if (uVar9 < uVar12) {
      if ((doc->pprint).indent[0].spaces < 0) {
        (doc->pprint).indent[0].spaces = uVar6;
      }
      (doc->pprint).wraphere = uVar7;
    }
    else if ((doc->pprint).ixInd == 0) {
      (doc->pprint).indent[1].spaces = uVar6;
      (doc->pprint).ixInd = 1;
    }
    if (uVar12 <= uVar9) {
      prvTidyPFlushLine(doc,iVar11 + uVar6);
      goto LAB_00149b09;
    }
  }
  if ((doc->pprint).linelen != 0) {
    AddChar(&doc->pprint,0x20);
  }
LAB_00149b09:
  bVar4 = *attrname;
  if (bVar4 != 0) {
    do {
      local_6c = (uint)bVar4;
      if ((char)bVar4 < '\0') {
        uVar7 = prvTidyGetUTF8((ctmbstr)attrname,&local_6c);
        attrname = attrname + uVar7;
      }
      else if (iVar1 == 1) {
        local_6c = prvTidyToUpper(local_6c);
      }
      AddChar(&doc->pprint,local_6c);
      bVar4 = attrname[1];
      attrname = attrname + 1;
    } while (bVar4 != 0);
  }
  CheckWrapIndent(doc,uVar6);
  pAVar2 = local_50;
  value = local_50->value;
  if (value == (ctmbstr)0x0) {
    BVar5 = prvTidyIsBoolAttribute(local_50);
    scriptAttr = prvTidyattrIsEvent(pAVar2);
    if (local_40 == 0) {
      if ((BVar5 != no) || (BVar5 = prvTidyIsNewNode(local_48), BVar5 != no)) {
        uVar7 = (doc->pprint).linelen;
        if ((ulong)(uVar7 + uVar6) < (doc->config).value[0x5d].v) {
          if ((doc->pprint).indent[0].spaces < 0) {
            (doc->pprint).indent[0].spaces = uVar6;
          }
          (doc->pprint).wraphere = uVar7;
          return;
        }
        if ((doc->pprint).ixInd != 0) {
          return;
        }
        (doc->pprint).indent[1].spaces = uVar6;
        (doc->pprint).ixInd = 1;
        return;
      }
      uVar7 = pAVar2->delim;
      value = "";
      BVar5 = yes;
    }
    else {
      if (BVar5 == no) {
        value = "";
      }
      else {
        value = pAVar2->attribute;
      }
      uVar7 = pAVar2->delim;
      BVar5 = no;
    }
  }
  else {
    uVar7 = local_50->delim;
    scriptAttr = no;
    BVar5 = (Bool)local_68;
  }
  PPrintAttrValue(doc,uVar6,value,uVar7,BVar5,scriptAttr);
  return;
}

Assistant:

static void PPrintAttribute( TidyDocImpl* doc, uint indent,
                             Node *node, AttVal *attr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool xmlOut    = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut  = cfgBool( doc, TidyXhtmlOut );
    Bool wrapAttrs = cfgBool( doc, TidyWrapAttVals );
    uint ucAttrs   = cfg( doc, TidyUpperCaseAttrs );
    Bool indAttrs  = cfgBool( doc, TidyIndentAttributes );
    uint xtra      = AttrIndent( doc, node, attr );
    Bool first     = (attr == node->attributes);
    tmbstr name    = attr->attribute;
    Bool wrappable = no;
    tchar c;

    /* fix for odd attribute indentation bug triggered by long values */
    if (!indAttrs)
      xtra = 0;

    if ( indAttrs )
    {
        if ( TY_(nodeIsElement)(node) && !first )
        {
            indent += xtra;
            PCondFlushLineSmart( doc, indent );
        }
    }

    CheckWrapIndent( doc, indent );

    if ( !xmlOut && !xhtmlOut && attr->dict )
    {
        if ( TY_(IsScript)(doc, name) )
            wrappable = cfgBool( doc, TidyWrapScriptlets );
        else if (!(attrIsCONTENT(attr) || attrIsVALUE(attr) || attrIsALT(attr) || attrIsTITLE(attr)) && wrapAttrs )
            wrappable = yes;
    }

    if ( !first && !SetWrap(doc, indent) )
    {
        TY_(PFlushLine)( doc, indent+xtra );  /* Put it on next line */
    }
    else if ( pprint->linelen > 0 )
    {
        AddChar( pprint, ' ' );
    }

    /* Attribute name */
    while (*name)
    {
        c = (unsigned char)*name;

        if (c > 0x7F)
            name += TY_(GetUTF8)(name, &c);
        else if (ucAttrs == TidyUppercaseYes)
            c = TY_(ToUpper)(c);

        AddChar(pprint, c);
        ++name;
    }

    CheckWrapIndent( doc, indent );
 
    if ( attr->value == NULL )
    {
        Bool isB = TY_(IsBoolAttribute)(attr);
        Bool scriptAttr = TY_(attrIsEvent)(attr);

        if ( xmlOut )
            PPrintAttrValue( doc, indent, isB ? attr->attribute : NULLSTR,
                             attr->delim, no, scriptAttr );

        else if ( !isB && !TY_(IsNewNode)(node) )
            PPrintAttrValue( doc, indent, "", attr->delim, yes, scriptAttr );

        else 
            SetWrap( doc, indent );
    }
    else
        PPrintAttrValue( doc, indent, attr->value, attr->delim, wrappable, no );
}